

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::form::iterator::iterator(iterator *this,iterator *other)

{
  long in_RSI;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *in_RDI;
  copy_ptr<cppcms::form::iterator::_data> *unaff_retaddr;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffe0;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *other_00;
  
  other_00 = in_RDI;
  std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::stack
            (in_stack_ffffffffffffffe0,in_RDI);
  in_RDI[1].c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_map = *(_Map_pointer *)(in_RSI + 0x50);
  *(undefined4 *)
   &in_RDI[1].c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Deque_impl_data._M_map_size = *(undefined4 *)(in_RSI + 0x58);
  booster::copy_ptr<cppcms::form::iterator::_data>::copy_ptr
            (unaff_retaddr,(copy_ptr<cppcms::form::iterator::_data> *)other_00);
  return;
}

Assistant:

form::iterator::iterator(form::iterator const &other) : 
	return_positions_(other.return_positions_),
	current_(other.current_),
	offset_(other.offset_),
	d(other.d)
{
}